

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathStringFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr ctxt_00;
  xmlChar *val;
  xmlXPathObjectPtr pxVar1;
  int error;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      pxVar1 = valuePop(ctxt);
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
        goto LAB_001db827;
      }
      error = 10;
    }
    else {
      error = 0x17;
    }
  }
  else {
    if (nargs == 0) {
      ctxt_00 = ctxt->context;
      val = xmlNodeGetContent(ctxt_00->node);
      if (val == (xmlChar *)0x0) {
        val = xmlStrdup("");
      }
      pxVar1 = xmlXPathCacheWrapString(ctxt_00,val);
LAB_001db827:
      valuePush(ctxt,pxVar1);
      return;
    }
    error = 0xc;
  }
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

void
xmlXPathStringFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;
    if (nargs == 0) {
    valuePush(ctxt,
	xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
	return;
    }

    CHECK_ARITY(1);
    cur = valuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    valuePush(ctxt, xmlXPathCacheConvertString(ctxt->context, cur));
}